

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorder.hpp
# Opt level: O2

void MGARD::data_reorder_3D<float>
               (float *data_pos,float *data_buffer,size_t n1,size_t n2,size_t n3,size_t dim0_stride,
               size_t dim1_stride)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  float *data_pos_00;
  long lVar4;
  long lVar5;
  bool bVar6;
  long local_60;
  
  local_60 = 0;
  sVar3 = n1;
  data_pos_00 = data_pos;
  while (bVar6 = sVar3 != 0, sVar3 = sVar3 - 1, bVar6) {
    data_reorder_2D<float>(data_pos_00,data_buffer,n2,n3,dim1_stride);
    local_60 = local_60 + dim0_stride * -4;
    data_pos_00 = data_pos_00 + dim0_stride;
  }
  if ((n1 & 1) == 0) {
    lVar5 = (long)data_pos + (dim0_stride * -8 - local_60);
    lVar4 = (long)data_pos + (dim0_stride * -4 - local_60);
    for (sVar3 = 0; sVar3 != n2; sVar3 = sVar3 + 1) {
      for (sVar2 = 0; n3 != sVar2; sVar2 = sVar2 + 1) {
        fVar1 = *(float *)(lVar4 + sVar2 * 4);
        *(float *)(lVar4 + sVar2 * 4) = (fVar1 + fVar1) - *(float *)(lVar5 + sVar2 * 4);
      }
      lVar4 = lVar4 + dim1_stride * 4;
      lVar5 = lVar5 + dim1_stride * 4;
    }
  }
  while (bVar6 = n2 != 0, n2 = n2 - 1, bVar6) {
    switch_rows_2D_by_buffer<float>(data_pos,data_buffer,n1,n3,dim0_stride);
    data_pos = data_pos + dim1_stride;
  }
  return;
}

Assistant:

void data_reorder_3D(T * data_pos, T * data_buffer, size_t n1, size_t n2, size_t n3, size_t dim0_stride, size_t dim1_stride){
    size_t n1_nodal = (n1 >> 1) + 1;
    size_t n1_coeff = n1 - n1_nodal;
    size_t n2_nodal = (n2 >> 1) + 1;
    size_t n2_coeff = n2 - n2_nodal;
    size_t n3_nodal = (n3 >> 1) + 1;
    size_t n3_coeff = n3 - n3_nodal;
    T * cur_data_pos = data_pos;
    // do 2D reorder
    for(int i=0; i<n1; i++){
        data_reorder_2D(cur_data_pos, data_buffer, n2, n3, dim1_stride);
        cur_data_pos += dim0_stride;
    }
    if(!(n1 & 1)){
        // n1 is even, change the last coeff plane into nodal plane
        cur_data_pos -= dim0_stride;
        for(int j=0; j<n2; j++){
            for(int k=0; k<n3; k++){
                cur_data_pos[k] = 2 * cur_data_pos[k] - cur_data_pos[- dim0_stride + k];
            }
            cur_data_pos += dim1_stride;
        }
    }
    cur_data_pos = data_pos;
    // reorder vertically
    for(int j=0; j<n2; j++){
        switch_rows_2D_by_buffer(cur_data_pos, data_buffer, n1, n3, dim0_stride);
        cur_data_pos += dim1_stride;
    }
}